

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseContextBase.cpp
# Opt level: O3

TVariable * __thiscall
glslang::TParseContextBase::getEditableVariable(TParseContextBase *this,char *name)

{
  TSymbolTable *this_00;
  int iVar1;
  undefined4 extraout_var;
  bool builtIn;
  TSymbol *symbol;
  bool local_51;
  pool_allocator<char> local_50;
  TString local_48;
  
  this_00 = this->symbolTable;
  local_50.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_48,
             name,&local_50);
  local_48._M_dataplus.super_allocator_type.allocator =
       (TPoolAllocator *)TSymbolTable::find(this_00,&local_48,&local_51,(bool *)0x0,(int *)0x0);
  if (local_48._M_dataplus.super_allocator_type.allocator != (TPoolAllocator *)0x0) {
    if (local_51 == true) {
      (*(this->super_TParseVersions)._vptr_TParseVersions[0x4e])(this,&local_48);
    }
    iVar1 = (*((_func_int **)(local_48._M_dataplus.super_allocator_type.allocator)->pageSize)[9])
                      (local_48._M_dataplus.super_allocator_type.allocator);
    return (TVariable *)CONCAT44(extraout_var,iVar1);
  }
  __assert_fail("symbol != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseContextBase.cpp"
                ,0x154,
                "virtual TVariable *glslang::TParseContextBase::getEditableVariable(const char *)");
}

Assistant:

TVariable* TParseContextBase::getEditableVariable(const char* name)
{
    bool builtIn;
    TSymbol* symbol = symbolTable.find(name, &builtIn);

    assert(symbol != nullptr);
    if (symbol == nullptr)
        return nullptr;

    if (builtIn)
        makeEditable(symbol);

    return symbol->getAsVariable();
}